

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decimal_cast.cpp
# Opt level: O3

hugeint_t duckdb::DecimalScaleDownCheckOperator::Operation<long,duckdb::hugeint_t>
                    (long input,ValidityMask *mask,idx_t idx,void *dataptr)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  uint8_t in_R8B;
  undefined7 in_register_00000081;
  hugeint_t hVar5;
  string error;
  undefined1 *local_a8 [2];
  undefined1 local_98 [16];
  string local_88;
  string local_68;
  string local_48;
  
  lVar1 = *(long *)(NumericHelper::POWERS_OF_TEN + (ulong)*(byte *)((long)dataptr + 0x31) * 8);
  lVar2 = -(input % lVar1);
  if (-1 < input) {
    lVar2 = input % lVar1;
  }
  lVar3 = -input;
  if (0 < input) {
    lVar3 = input;
  }
  lVar4 = 0;
  if (lVar1 / 2 <= lVar2) {
    lVar4 = lVar1;
  }
  lVar4 = lVar4 + lVar3;
  lVar1 = *(long *)((long)dataptr + 0x20);
  if (lVar4 < lVar1 && (lVar4 != -lVar1 && SBORROW8(lVar4,-lVar1) == lVar4 + lVar1 < 0)) {
    hVar5 = DecimalScaleDownOperator::Operation<long,duckdb::hugeint_t>(input,mask,idx,dataptr);
    return hVar5;
  }
  local_a8[0] = local_98;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_a8,"Casting value \"%s\" to type %s failed: value is out of range!","")
  ;
  Decimal::ToString_abi_cxx11_
            (&local_68,(Decimal *)input,(ulong)*(byte *)((long)dataptr + 0x30),
             *(uint8_t *)((long)dataptr + 0x31),in_R8B);
  LogicalType::ToString_abi_cxx11_(&local_88,(LogicalType *)(*dataptr + 8));
  StringUtil::Format<std::__cxx11::string,std::__cxx11::string>
            (&local_48,(StringUtil *)local_a8,&local_68,&local_88,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT71(in_register_00000081,in_R8B));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  if (local_a8[0] != local_98) {
    operator_delete(local_a8[0]);
  }
  hVar5 = HandleVectorCastError::Operation<duckdb::hugeint_t>
                    (&local_48,mask,idx,(VectorTryCastData *)((long)dataptr + 8));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  return hVar5;
}

Assistant:

static RESULT_TYPE Operation(INPUT_TYPE input, ValidityMask &mask, idx_t idx, void *dataptr) {
		auto data = static_cast<DecimalScaleInput<INPUT_TYPE> *>(dataptr);
		if (!CanScaleDownDecimal(input, *data)) {
			auto error = StringUtil::Format("Casting value \"%s\" to type %s failed: value is out of range!",
			                                Decimal::ToString(input, data->source_width, data->source_scale),
			                                data->result.GetType().ToString());
			return HandleVectorCastError::Operation<RESULT_TYPE>(std::move(error), mask, idx, data->vector_cast_data);
		}
		return DecimalScaleDownOperator::Operation<INPUT_TYPE, RESULT_TYPE>(input, mask, idx, dataptr);
	}